

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O0

bool adiak::internal::
     set_tuple_type<std::tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_2UL>
     ::setvalue(tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                *c,adiak_value_t *values,adiak_datatype_t *dtype)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<vector<basic_string<char>,_allocator<basic_string<char>_>_>,_vector<double,_allocator<double>_>,_vector<double,_allocator<double>_>_>_>
  *c_00;
  bool result;
  adiak_datatype_t *dtype_local;
  adiak_value_t *values_local;
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  *c_local;
  
  bVar1 = set_tuple_type<std::tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_1UL>
          ::setvalue(c,values,dtype);
  if (bVar1) {
    c_00 = std::
           get<1ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                     (c);
    c_local._7_1_ =
         parse<std::vector<double,_std::allocator<double>_>_>::make_value
                   (c_00,values + 1,dtype->subtype[1]);
  }
  else {
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

static bool setvalue(T &c, adiak_value_t *values, adiak_datatype_t *dtype) {
            bool result = set_tuple_type<T, I-1>::setvalue(c, values, dtype);
            if (!result)
               return false;
            return parse<typename std::tuple_element<I-1, T>::type>::make_value(std::get<I-1>(c), values+I-1, dtype->subtype[I-1]);
         }